

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall cmComputeLinkInformation::AddFullItem(cmComputeLinkInformation *this,string *item)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  PolicyStatus PVar5;
  long lVar6;
  iterator iVar7;
  LinkType lt;
  string file;
  string generator;
  Item local_70;
  long *local_40 [2];
  long local_30 [2];
  
  bVar4 = CheckImplicitDirItem(this,item);
  if (bVar4) {
    return;
  }
  if ((this->NoSONameUsesPath == true) && (bVar4 = CheckSharedLibNoSOName(this,item), bVar4)) {
    return;
  }
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[2])(local_40);
  PVar5 = cmPolicies::PolicyMap::Get(&this->Target->PolicyMap,CMP0008);
  if ((PVar5 == NEW) ||
     ((lVar6 = std::__cxx11::string::find((char *)local_40,0x4c5115,0), lVar6 == -1 &&
      (lVar6 = std::__cxx11::string::find((char *)local_40,0x4c5123,0), lVar6 == -1)))) {
LAB_0035a1fc:
    if (this->LinkTypeEnabled == true) {
      cmsys::SystemTools::GetFilenameName(&local_70.Value,item);
      bVar4 = cmsys::RegularExpression::find
                        (&this->ExtractSharedLibraryName,local_70.Value._M_dataplus._M_p);
      lt = LinkShared;
      if (bVar4) {
LAB_0035a245:
        SetCurrentLinkType(this,lt);
      }
      else {
        bVar4 = cmsys::RegularExpression::find
                          (&this->ExtractStaticLibraryName,(item->_M_dataplus)._M_p);
        if (!bVar4) {
          lt = this->StartLinkType;
          goto LAB_0035a245;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.Value._M_dataplus._M_p != &local_70.Value.field_2) {
        operator_delete(local_70.Value._M_dataplus._M_p,
                        local_70.Value.field_2._M_allocated_capacity + 1);
      }
    }
    if (this->OldLinkDirMode == true) {
      cmsys::SystemTools::GetFilenamePath(&local_70.Value,item);
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->OldLinkDirMask)._M_t,&local_70.Value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.Value._M_dataplus._M_p != &local_70.Value.field_2) {
        operator_delete(local_70.Value._M_dataplus._M_p,
                        local_70.Value.field_2._M_allocated_capacity + 1);
      }
      if ((_Rb_tree_header *)iVar7._M_node ==
          &(this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->OldLinkDirItems,item);
      }
    }
    sVar2 = (this->LibLinkFileFlag)._M_string_length;
    if (sVar2 != 0) {
      paVar1 = &local_70.Value.field_2;
      pcVar3 = (this->LibLinkFileFlag)._M_dataplus._M_p;
      local_70.Value._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar3,pcVar3 + sVar2);
      local_70.IsPath = false;
      local_70.Target = (cmTarget *)0x0;
      std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
      emplace_back<cmComputeLinkInformation::Item>(&this->Items,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.Value._M_dataplus._M_p != paVar1) {
        operator_delete(local_70.Value._M_dataplus._M_p,
                        local_70.Value.field_2._M_allocated_capacity + 1);
      }
    }
    paVar1 = &local_70.Value.field_2;
    pcVar3 = (item->_M_dataplus)._M_p;
    local_70.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar3,pcVar3 + item->_M_string_length);
    local_70.IsPath = true;
    local_70.Target = (cmTarget *)0x0;
    std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
    emplace_back<cmComputeLinkInformation::Item>(&this->Items,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.Value._M_dataplus._M_p == paVar1) goto LAB_0035a36e;
  }
  else {
    cmsys::SystemTools::GetFilenameName(&local_70.Value,item);
    bVar4 = cmsys::RegularExpression::find
                      (&this->ExtractAnyLibraryName,local_70.Value._M_dataplus._M_p);
    if (bVar4) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.Value._M_dataplus._M_p != &local_70.Value.field_2) {
        operator_delete(local_70.Value._M_dataplus._M_p,
                        local_70.Value.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0035a1fc;
    }
    HandleBadFullItem(this,item,&local_70.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.Value._M_dataplus._M_p == &local_70.Value.field_2) goto LAB_0035a36e;
  }
  operator_delete(local_70.Value._M_dataplus._M_p,local_70.Value.field_2._M_allocated_capacity + 1);
LAB_0035a36e:
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddFullItem(std::string const& item)
{
  // Check for the implicit link directory special case.
  if(this->CheckImplicitDirItem(item))
    {
    return;
    }

  // Check for case of shared library with no builtin soname.
  if(this->NoSONameUsesPath && this->CheckSharedLibNoSOName(item))
    {
    return;
    }

  // Full path libraries should specify a valid library file name.
  // See documentation of CMP0008.
  std::string generator = this->GlobalGenerator->GetName();
  if(this->Target->GetPolicyStatusCMP0008() != cmPolicies::NEW &&
     (generator.find("Visual Studio") != generator.npos ||
      generator.find("Xcode") != generator.npos))
    {
    std::string file = cmSystemTools::GetFilenameName(item);
    if(!this->ExtractAnyLibraryName.find(file.c_str()))
      {
      this->HandleBadFullItem(item, file);
      return;
      }
    }

  // This is called to handle a link item that is a full path.
  // If the target is not a static library make sure the link type is
  // shared.  This is because dynamic-mode linking can handle both
  // shared and static libraries but static-mode can handle only
  // static libraries.  If a previous user item changed the link type
  // to static we need to make sure it is back to shared.
  if(this->LinkTypeEnabled)
    {
    std::string name = cmSystemTools::GetFilenameName(item);
    if(this->ExtractSharedLibraryName.find(name))
      {
      this->SetCurrentLinkType(LinkShared);
      }
    else if(!this->ExtractStaticLibraryName.find(item))
      {
      // We cannot determine the type.  Assume it is the target's
      // default type.
      this->SetCurrentLinkType(this->StartLinkType);
      }
    }

  // For compatibility with CMake 2.4 include the item's directory in
  // the linker search path.
  if(this->OldLinkDirMode &&
     this->OldLinkDirMask.find(cmSystemTools::GetFilenamePath(item)) ==
     this->OldLinkDirMask.end())
    {
    this->OldLinkDirItems.push_back(item);
    }

  // If this platform wants a flag before the full path, add it.
  if(!this->LibLinkFileFlag.empty())
    {
    this->Items.push_back(Item(this->LibLinkFileFlag, false));
    }

  // Now add the full path to the library.
  this->Items.push_back(Item(item, true));
}